

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O2

void snapshot_before_block_reuse_test(bool inmem)

{
  FILE *pFVar1;
  undefined4 uVar2;
  void *pvVar3;
  fdb_status fVar4;
  sb_decision_t sVar5;
  char *pcVar6;
  int iVar7;
  undefined7 in_register_00000039;
  int iVar8;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *snap_db;
  undefined4 local_2b8;
  int local_2b4;
  void *rvalue;
  size_t rvalue_len;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_config fconfig;
  char bodybuf [256];
  
  memleak_start();
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  staleblktest* > errorlog.txt");
  fconfig.num_keeping_headers = 1;
  fVar4 = fdb_open(&dbfile,"./staleblktest1",&fconfig);
  pFVar1 = _stderr;
  if (fVar4 != FDB_RESULT_SUCCESS) {
    pcVar6 = fdb_error_msg(fVar4);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar4,pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x20a);
    snapshot_before_block_reuse_test(bool)::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x20a,"void snapshot_before_block_reuse_test(bool)");
  }
  fVar4 = fdb_kvs_open_default(dbfile,&db,&kvs_config);
  pFVar1 = _stderr;
  if (fVar4 != FDB_RESULT_SUCCESS) {
    pcVar6 = fdb_error_msg(fVar4);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar4,pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x20c);
    snapshot_before_block_reuse_test(bool)::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x20c,"void snapshot_before_block_reuse_test(bool)");
  }
  fVar4 = fdb_set_kv(db,"key",4,"snp",4);
  pFVar1 = _stderr;
  if (fVar4 != FDB_RESULT_SUCCESS) {
    pcVar6 = fdb_error_msg(fVar4);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar4,pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x213);
    snapshot_before_block_reuse_test(bool)::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x213,"void snapshot_before_block_reuse_test(bool)");
  }
  fVar4 = fdb_commit(dbfile,'\x01');
  pFVar1 = _stderr;
  if (fVar4 != FDB_RESULT_SUCCESS) {
    pcVar6 = fdb_error_msg(fVar4);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar4,pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x217);
    snapshot_before_block_reuse_test(bool)::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x217,"void snapshot_before_block_reuse_test(bool)");
  }
  local_2b8 = (undefined4)CONCAT71(in_register_00000039,inmem);
  if (inmem) {
    fVar4 = fdb_snapshot_open(db,&snap_db,0xffffffffffffffff);
    pFVar1 = _stderr;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pcVar6 = fdb_error_msg(fVar4);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar4,pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x21c);
      snapshot_before_block_reuse_test(bool)::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x21c,"void snapshot_before_block_reuse_test(bool)");
    }
  }
  else {
    fVar4 = fdb_snapshot_open(db,&snap_db,1);
    pFVar1 = _stderr;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pcVar6 = fdb_error_msg(fVar4);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar4,pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x21f);
      snapshot_before_block_reuse_test(bool)::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x21f,"void snapshot_before_block_reuse_test(bool)");
    }
  }
  iVar8 = 1;
  do {
    fVar4 = fdb_set_kv(db,"key",4,"val",4);
    pFVar1 = _stderr;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pcVar6 = fdb_error_msg(fVar4);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar4,pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x228);
      snapshot_before_block_reuse_test(bool)::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x228,"void snapshot_before_block_reuse_test(bool)");
    }
    fVar4 = fdb_get_file_info(dbfile,&file_info);
    pFVar1 = _stderr;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pcVar6 = fdb_error_msg(fVar4);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar4,pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x22b);
      snapshot_before_block_reuse_test(bool)::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x22b,"void snapshot_before_block_reuse_test(bool)");
    }
    local_2b4 = iVar8 + 1;
    iVar8 = local_2b4;
  } while (file_info.file_size < 0x1000001);
  iVar8 = 0;
  while (iVar7 = local_2b4, iVar8 != 5) {
    while (iVar7 = iVar7 + -1, iVar7 != 0) {
      fVar4 = fdb_set_kv(db,"key",4,"val",4);
      pFVar1 = _stderr;
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pcVar6 = fdb_error_msg(fVar4);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar4,pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x232);
        snapshot_before_block_reuse_test(bool)::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x232,"void snapshot_before_block_reuse_test(bool)");
      }
    }
    fVar4 = fdb_commit(dbfile,'\x01');
    pFVar1 = _stderr;
    iVar8 = iVar8 + 1;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pcVar6 = fdb_error_msg(fVar4);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar4,pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x236);
      snapshot_before_block_reuse_test(bool)::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x236,"void snapshot_before_block_reuse_test(bool)");
    }
  }
  sVar5 = sb_check_block_reusing(db);
  if (sVar5 != SBD_RECLAIM) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x23b);
    snapshot_before_block_reuse_test(bool)::__test_pass = 1;
    __assert_fail("sb_decision == SBD_RECLAIM",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x23b,"void snapshot_before_block_reuse_test(bool)");
  }
  fVar4 = fdb_get_kv(snap_db,"key",4,&rvalue,&rvalue_len);
  pvVar3 = rvalue;
  pFVar1 = _stderr;
  if (fVar4 != FDB_RESULT_SUCCESS) {
    pcVar6 = fdb_error_msg(fVar4);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar4,pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x23f);
    snapshot_before_block_reuse_test(bool)::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x23f,"void snapshot_before_block_reuse_test(bool)");
  }
  iVar8 = bcmp(rvalue,"snp",rvalue_len);
  if (iVar8 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","snp",pvVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x240);
    snapshot_before_block_reuse_test(bool)::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x240,"void snapshot_before_block_reuse_test(bool)");
  }
  fVar4 = fdb_kvs_close(snap_db);
  pFVar1 = _stderr;
  if (fVar4 != FDB_RESULT_SUCCESS) {
    pcVar6 = fdb_error_msg(fVar4);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar4,pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x244);
    snapshot_before_block_reuse_test(bool)::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x244,"void snapshot_before_block_reuse_test(bool)");
  }
  while (iVar7 = iVar7 + -1, iVar7 != 0) {
    fVar4 = fdb_set_kv(db,"key",4,"val",4);
    pFVar1 = _stderr;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pcVar6 = fdb_error_msg(fVar4);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar4,pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x24a);
      snapshot_before_block_reuse_test(bool)::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x24a,"void snapshot_before_block_reuse_test(bool)");
    }
  }
  fVar4 = fdb_commit(dbfile,'\x01');
  pFVar1 = _stderr;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    fVar4 = fdb_snapshot_open(db,&snap_db,1);
    uVar2 = local_2b8;
    if (fVar4 != FDB_RESULT_NO_DB_INSTANCE) {
      if ((fVar4 == FDB_RESULT_SUCCESS) &&
         (fVar4 = fdb_kvs_close(snap_db), pFVar1 = _stderr, fVar4 != FDB_RESULT_SUCCESS)) {
        pcVar6 = fdb_error_msg(fVar4);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar4,pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x254);
        snapshot_before_block_reuse_test(bool)::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x254,"void snapshot_before_block_reuse_test(bool)");
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x256);
      snapshot_before_block_reuse_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_NO_DB_INSTANCE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x256,"void snapshot_before_block_reuse_test(bool)");
    }
    fVar4 = fdb_free_block(rvalue);
    pFVar1 = _stderr;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pcVar6 = fdb_error_msg(fVar4);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar4,pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x259);
      snapshot_before_block_reuse_test(bool)::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x259,"void snapshot_before_block_reuse_test(bool)");
    }
    fVar4 = fdb_kvs_close(db);
    pFVar1 = _stderr;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pcVar6 = fdb_error_msg(fVar4);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar4,pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x25b);
      snapshot_before_block_reuse_test(bool)::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x25b,"void snapshot_before_block_reuse_test(bool)");
    }
    fVar4 = fdb_close(dbfile);
    pFVar1 = _stderr;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pcVar6 = fdb_error_msg(fVar4);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar4,pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x25d);
      snapshot_before_block_reuse_test(bool)::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x25d,"void snapshot_before_block_reuse_test(bool)");
    }
    fdb_shutdown();
    memleak_end();
    pcVar6 = "disk snapshot";
    if ((char)uVar2 != '\0') {
      pcVar6 = "in-mem snapshot";
    }
    sprintf(bodybuf,"snapshot before block reuse test %s",pcVar6);
    pcVar6 = "%s PASSED\n";
    if (snapshot_before_block_reuse_test(bool)::__test_pass != '\0') {
      pcVar6 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar6,bodybuf);
    return;
  }
  pcVar6 = fdb_error_msg(fVar4);
  fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar4,pcVar6,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0x24d);
  snapshot_before_block_reuse_test(bool)::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x24d,"void snapshot_before_block_reuse_test(bool)");
}

Assistant:

void snapshot_before_block_reuse_test(bool inmem) {
    memleak_start();
    TEST_INIT();

    int i, j, n, r;
    void *rvalue;
    size_t rvalue_len;
    char bodybuf[256];
    fdb_file_handle* dbfile;
    fdb_kvs_handle *db, *snap_db;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    sb_decision_t sb_decision;
    fdb_file_info file_info;

    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fconfig.num_keeping_headers = 1;
    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_STATUS(status);

    const char *key = "key";
    const char *val = "snp";

    // set key
    status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
    TEST_STATUS(status);

    // commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // open snapshot
    if (inmem) {
        status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
        TEST_STATUS(status);
    } else {
        status = fdb_snapshot_open(db, &snap_db, 1);
        TEST_STATUS(status);
    }

    val = "val";

    // initial load to reuse
    i = 0;
    do {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size <= SB_MIN_BLOCK_REUSING_FILESIZE);

    // 5 update cycles of created items
    for (n = 0; n < 5; n++) {
        for(j = 0; j < i; j++) {
            status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
            TEST_STATUS(status);
        }
        // commit
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // verify in reclaim mode
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    // expect pre-reuse data retained
    status = fdb_get_kv(snap_db, key, strlen(key) + 1, &rvalue, &rvalue_len);
    TEST_STATUS(status);
    TEST_CMP(rvalue, (char *)"snp", rvalue_len);

    // close snapshot
    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);

    // do another update cycle
    for (j = 0; j < i; j++) {
        // commit
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // attempt to open again will fail
    status = fdb_snapshot_open(db, &snap_db, 1);
    if (status == FDB_RESULT_SUCCESS) {
        // close incase kv was unexpectedly opened
        status = fdb_kvs_close(snap_db);
        TEST_STATUS(status);
    }
    TEST_CHK(status == FDB_RESULT_NO_DB_INSTANCE);

    status = fdb_free_block(rvalue);
    TEST_STATUS(status);
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf,"snapshot before block reuse test %s", inmem ?
            "in-mem snapshot" : "disk snapshot");
    TEST_RESULT(bodybuf);
}